

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Own<kj::NetworkAddress> __thiscall
kj::anon_unknown_30::SocketNetwork::getSockaddr(SocketNetwork *this,void *sockaddr,uint len)

{
  char cVar1;
  uint in_ECX;
  undefined4 in_register_00000014;
  NetworkAddress *extraout_RDX;
  Own<kj::NetworkAddress> OVar2;
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress> array;
  Own<kj::(anonymous_namespace)::NetworkAddressImpl> local_c8;
  Fault f;
  
  heapArrayBuilder<kj::(anonymous_namespace)::SocketAddress>(&array,1);
  SocketAddress::SocketAddress
            ((SocketAddress *)&f,(void *)CONCAT44(in_register_00000014,len),in_ECX);
  memcpy(array.pos,&f,0x88);
  array.pos = array.pos + 1;
  cVar1 = (*(code *)**(undefined8 **)((long)sockaddr + 0x10))
                    ((NetworkFilter *)((long)sockaddr + 0x10),&(array.ptr)->addr,
                     (array.ptr)->addrlen);
  if (cVar1 == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[35]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x50b,FAILED,"array[0].allowedBy(filter)","\"address blocked by restrictPeers()\"",
               (char (*) [35])"address blocked by restrictPeers()");
    kj::_::Debug::Fault::~Fault(&f);
  }
  f.exception = (Exception *)array.ptr;
  array.ptr = (SocketAddress *)0x0;
  array.pos = (RemoveConst<kj::(anonymous_namespace)::SocketAddress> *)0x0;
  array.endPtr = (SocketAddress *)0x0;
  heap<kj::(anonymous_namespace)::NetworkAddressImpl,kj::LowLevelAsyncIoProvider&,kj::_::NetworkFilter&,kj::Array<kj::(anonymous_namespace)::SocketAddress>>
            ((kj *)&local_c8,*(LowLevelAsyncIoProvider **)((long)sockaddr + 8),
             (NetworkFilter *)((long)sockaddr + 0x10),
             (Array<kj::(anonymous_namespace)::SocketAddress> *)&f);
  (this->super_Network)._vptr_Network = (_func_int **)local_c8.disposer;
  this->lowLevel = (LowLevelAsyncIoProvider *)local_c8.ptr;
  local_c8.ptr = (NetworkAddressImpl *)0x0;
  Own<kj::(anonymous_namespace)::NetworkAddressImpl>::~Own(&local_c8);
  Array<kj::(anonymous_namespace)::SocketAddress>::~Array
            ((Array<kj::(anonymous_namespace)::SocketAddress> *)&f);
  ArrayBuilder<kj::(anonymous_namespace)::SocketAddress>::dispose(&array);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<NetworkAddress> getSockaddr(const void* sockaddr, uint len) override {
    auto array = kj::heapArrayBuilder<SocketAddress>(1);
    array.add(SocketAddress(sockaddr, len));
    KJ_REQUIRE(array[0].allowedBy(filter), "address blocked by restrictPeers()") { break; }
    return Own<NetworkAddress>(heap<NetworkAddressImpl>(lowLevel, filter, array.finish()));
  }